

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextGLImpl::BindProgramResources(DeviceContextGLImpl *this,Uint32 BindSRBMask)

{
  SRBMaskType *pSVar1;
  PipelineStateGLImpl *this_00;
  ShaderResourceCacheGL *this_01;
  pointer ppTVar2;
  pointer ppTVar3;
  TextureBaseGL *pTVar4;
  pointer ppBVar5;
  pointer ppBVar6;
  BufferGLImpl *pBVar7;
  TBindings *BaseBindings;
  vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *in_RCX;
  uint uVar8;
  pointer ppTVar9;
  pointer ppBVar10;
  vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_> *in_R8;
  bool bVar11;
  string msg;
  Uint32 sign;
  string local_68;
  uint local_44;
  vector<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_> *local_40;
  vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *local_38;
  
  if (BindSRBMask == 0) {
    FormatString<char[26],char[17]>
              (&local_68,(Diligent *)"Debug expression failed:\n",(char (*) [26])"BindSRBMask != 0",
               (char (*) [17])in_RCX);
    in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)0x2b2;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_BoundWritableTextures).
      super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_BoundWritableTextures).
      super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[32]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BoundWritableTextures.empty()",(char (*) [32])in_RCX);
    in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)0x2b6;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_BoundWritableBuffers).
      super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_BoundWritableBuffers).
      super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[31]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_BoundWritableBuffers.empty()",(char (*) [31])in_RCX);
    in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)0x2b7;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"BindProgramResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x2b7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;
  if (BindSRBMask != 0) {
    local_38 = &this->m_BoundWritableTextures;
    local_40 = &this->m_BoundWritableBuffers;
    do {
      uVar8 = 0;
      if (BindSRBMask != 0) {
        for (; (BindSRBMask >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      this_00 = (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
                m_pObject;
      local_44 = uVar8;
      PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
                (&this_00->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      if ((this_00->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount <= uVar8
         ) {
        FormatString<char[26],char[53]>
                  (&local_68,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"sign < m_pPipelineState->GetResourceSignatureCount()",
                   (char (*) [53])in_RCX);
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"BindProgramResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x2bf);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      BaseBindings = PipelineStateGLImpl::GetBaseBindings
                               ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                                m_pPipelineState.m_pObject,local_44);
      in_RCX = *(vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> **)
                BaseBindings->_M_elems;
      *(vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> **)
       ((long)(&(this->m_BindInfo).super_CommittedShaderResources.CacheRevisions + 1) +
       (ulong)local_44 * 8 + 4) = in_RCX;
      this_01 = (this->m_BindInfo).super_CommittedShaderResources.ResourceCaches._M_elems[local_44];
      if (this_01 == (ShaderResourceCacheGL *)0x0) {
        FormatString<char[25],unsigned_int,char[9]>
                  (&local_68,(Diligent *)"Resource cache at index ",(char (*) [25])&local_44,
                   (uint *)0x82c739,(char (*) [9])in_R8);
        in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)
                 0x2c6;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"BindProgramResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                   ,0x2c6);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      uVar8 = -BindSRBMask & BindSRBMask;
      if ((uVar8 & (this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask) == 0) {
        if ((uVar8 & (this->m_BindInfo).super_CommittedShaderResources.DynamicSRBMask) == 0) {
          FormatString<char[104]>
                    (&local_68,
                     (char (*) [104])
                     "When bit in StaleSRBMask is not set, the same bit in DynamicSRBMask must be set. Check GetCommitMask()."
                    );
          in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)
                   0x2cc;
          DebugAssertionFailed
                    (local_68._M_dataplus._M_p,"BindProgramResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x2cc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        if (this_01->m_DynamicSSBOMask == 0 && this_01->m_DynamicUBOMask == 0) {
          FormatString<char[209]>
                    (&local_68,
                     (char (*) [209])
                     "Bit in DynamicSRBMask is set, but the cache does not contain dynamic resources. This may indicate that resources in the cache have changed, but the SRB has not been committed before the draw/dispatch command."
                    );
          in_RCX = (vector<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_> *)
                   0x2cf;
          DebugAssertionFailed
                    (local_68._M_dataplus._M_p,"BindProgramResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x2cf);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        ShaderResourceCacheGL::BindDynamicBuffers(this_01,&this->m_ContextState,BaseBindings);
      }
      else {
        in_RCX = local_38;
        in_R8 = local_40;
        ShaderResourceCacheGL::BindResources
                  (this_01,&this->m_ContextState,BaseBindings,local_38,local_40);
      }
      bVar11 = uVar8 != BindSRBMask;
      BindSRBMask = uVar8 ^ BindSRBMask;
    } while (bVar11);
  }
  pSVar1 = &(this->m_BindInfo).super_CommittedShaderResources.StaleSRBMask;
  *pSVar1 = *pSVar1 & ~(this->m_BindInfo).super_CommittedShaderResources.ActiveSRBMask;
  ppTVar2 = (this->m_BoundWritableTextures).
            super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (this->m_BoundWritableTextures).
            super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppTVar9 = ppTVar2;
  if (ppTVar2 != ppTVar3) {
    do {
      pTVar4 = *ppTVar9;
      this->m_CommittedResourcesTentativeBarriers =
           this->m_CommittedResourcesTentativeBarriers | MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;
      (pTVar4->super_AsyncWritableResource).m_PendingMemoryBarriers =
           (pTVar4->super_AsyncWritableResource).m_PendingMemoryBarriers |
           MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;
      ppTVar9 = ppTVar9 + 1;
    } while (ppTVar9 != ppTVar3);
    if (ppTVar2 != ppTVar3) {
      (this->m_BoundWritableTextures).
      super__Vector_base<Diligent::TextureBaseGL_*,_std::allocator<Diligent::TextureBaseGL_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppTVar2;
    }
  }
  ppBVar5 = (this->m_BoundWritableBuffers).
            super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar6 = (this->m_BoundWritableBuffers).
            super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppBVar10 = ppBVar5;
  if (ppBVar5 != ppBVar6) {
    do {
      pBVar7 = *ppBVar10;
      this->m_CommittedResourcesTentativeBarriers =
           this->m_CommittedResourcesTentativeBarriers | MEMORY_BARRIER_ALL_BUFFER_BARRIERS;
      (pBVar7->super_AsyncWritableResource).m_PendingMemoryBarriers =
           (pBVar7->super_AsyncWritableResource).m_PendingMemoryBarriers |
           MEMORY_BARRIER_ALL_BUFFER_BARRIERS;
      ppBVar10 = ppBVar10 + 1;
    } while (ppBVar10 != ppBVar6);
    if (ppBVar5 != ppBVar6) {
      (this->m_BoundWritableBuffers).
      super__Vector_base<Diligent::BufferGLImpl_*,_std::allocator<Diligent::BufferGLImpl_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppBVar5;
    }
  }
  return;
}

Assistant:

void DeviceContextGLImpl::BindProgramResources(Uint32 BindSRBMask)
{
    VERIFY_EXPR(BindSRBMask != 0);
    //if (m_CommittedResourcesTentativeBarriers != 0)
    //    LOG_INFO_MESSAGE("Not all tentative resource barriers have been executed since the last call to CommitShaderResources(). Did you forget to call Draw()/DispatchCompute() ?");

    VERIFY_EXPR(m_BoundWritableTextures.empty());
    VERIFY_EXPR(m_BoundWritableBuffers.empty());

    m_CommittedResourcesTentativeBarriers = MEMORY_BARRIER_NONE;

    while (BindSRBMask != 0)
    {
        Uint32 SignBit = ExtractLSB(BindSRBMask);
        Uint32 sign    = PlatformMisc::GetLSB(SignBit);
        VERIFY_EXPR(sign < m_pPipelineState->GetResourceSignatureCount());
        const PipelineStateGLImpl::TBindings& BaseBindings = m_pPipelineState->GetBaseBindings(sign);
#ifdef DILIGENT_DEVELOPMENT
        m_BindInfo.BaseBindings[sign] = BaseBindings;
#endif

        const ShaderResourceCacheImplType* pResourceCache = m_BindInfo.ResourceCaches[sign];
        DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", sign, " is null");
        if (m_BindInfo.StaleSRBMask & SignBit)
            pResourceCache->BindResources(GetContextState(), BaseBindings, m_BoundWritableTextures, m_BoundWritableBuffers);
        else
        {
            VERIFY((m_BindInfo.DynamicSRBMask & SignBit) != 0,
                   "When bit in StaleSRBMask is not set, the same bit in DynamicSRBMask must be set. Check GetCommitMask().");
            DEV_CHECK_ERR(pResourceCache->HasDynamicResources(),
                          "Bit in DynamicSRBMask is set, but the cache does not contain dynamic resources. This may indicate that resources "
                          "in the cache have changed, but the SRB has not been committed before the draw/dispatch command.");
            pResourceCache->BindDynamicBuffers(GetContextState(), BaseBindings);
        }
    }
    m_BindInfo.StaleSRBMask &= ~m_BindInfo.ActiveSRBMask;


#if GL_ARB_shader_image_load_store
    // Go through the list of textures bound as AUVs and set the required memory barriers
    for (TextureBaseGL* pWritableTex : m_BoundWritableTextures)
    {
        constexpr MEMORY_BARRIER TextureMemBarriers = MEMORY_BARRIER_ALL_TEXTURE_BARRIERS;

        m_CommittedResourcesTentativeBarriers |= TextureMemBarriers;

        // Set new required barriers for the time when texture is used next time
        pWritableTex->SetPendingMemoryBarriers(TextureMemBarriers);
    }
    m_BoundWritableTextures.clear();

    for (BufferGLImpl* pWritableBuff : m_BoundWritableBuffers)
    {
        constexpr MEMORY_BARRIER BufferMemoryBarriers = MEMORY_BARRIER_ALL_BUFFER_BARRIERS;

        m_CommittedResourcesTentativeBarriers |= BufferMemoryBarriers;
        // Set new required barriers for the time when buffer is used next time
        pWritableBuff->SetPendingMemoryBarriers(BufferMemoryBarriers);
    }
    m_BoundWritableBuffers.clear();
#endif
}